

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

int xmlPythonFileWrite(void *context,char *buffer,int len)

{
  int iVar1;
  int iVar2;
  PyObject *op;
  PyObject *op_00;
  char *pcVar3;
  
  iVar2 = -1;
  if (context == (void *)0x0) {
    return -1;
  }
  op = (PyObject *)PyUnicode_FromStringAndSize(buffer,(long)len);
  if (op == (PyObject *)0x0) {
    return -1;
  }
  pcVar3 = "io_write";
  iVar1 = PyObject_HasAttrString(context,"io_write");
  if (iVar1 == 0) {
    pcVar3 = "write";
    iVar1 = PyObject_HasAttrString(context,"write");
    if (iVar1 == 0) {
      op_00 = (PyObject *)0x0;
      goto LAB_0013bc73;
    }
  }
  op_00 = (PyObject *)PyEval_CallMethod(context,pcVar3,"(O)",op);
LAB_0013bc73:
  _Py_DECREF(op);
  if (op_00 == (PyObject *)0x0) {
    puts("xmlPythonFileWrite: result is NULL");
  }
  else {
    if ((op_00->ob_type->tp_flags & 0x1000000) == 0) {
      if (op_00 == (PyObject *)&_Py_NoneStruct) {
        _Py_DECREF((PyObject *)&_Py_NoneStruct);
        return len;
      }
      puts("xmlPythonFileWrite: result is not an Int nor None");
    }
    else {
      iVar2 = PyLong_AsLong(op_00);
    }
    _Py_DECREF(op_00);
  }
  return iVar2;
}

Assistant:

static int
xmlPythonFileWrite (void * context, const char * buffer, int len) {
    PyObject *file;
    PyObject *string;
    PyObject *ret = NULL;
    int written = -1;

#ifdef DEBUG_FILES
    printf("xmlPythonFileWrite: %d\n", len);
#endif
    file = (PyObject *) context;
    if (file == NULL) return(-1);
    string = PY_IMPORT_STRING_SIZE(buffer, len);
    if (string == NULL) return(-1);
    if (PyObject_HasAttrString(file, (char *) "io_write")) {
        ret = PyEval_CallMethod(file, (char *) "io_write", (char *) "(O)",
	                        string);
    } else if (PyObject_HasAttrString(file, (char *) "write")) {
        ret = PyEval_CallMethod(file, (char *) "write", (char *) "(O)",
	                        string);
    }
    Py_DECREF(string);
    if (ret == NULL) {
	printf("xmlPythonFileWrite: result is NULL\n");
	return(-1);
    } else if (PyLong_Check(ret)) {
	written = (int) PyLong_AsLong(ret);
	Py_DECREF(ret);
    } else if (ret == Py_None) {
	written = len;
	Py_DECREF(ret);
    } else {
	printf("xmlPythonFileWrite: result is not an Int nor None\n");
	Py_DECREF(ret);
    }
    return(written);
}